

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::keyReleaseEvent(QLineEdit *this,QKeyEvent *e)

{
  QWidgetPrivate *this_00;
  QWidgetLineControl *this_01;
  QLineEditPrivate *d;
  
  this_00 = *(QWidgetPrivate **)&(this->super_QWidget).field_0x8;
  this_01 = *(QWidgetLineControl **)(this_00 + 1);
  if (((byte)this_01[0x50] & 4) == 0) {
    QWidgetPrivate::handleSoftwareInputPanel(this_00,false);
    this_01 = *(QWidgetLineControl **)(this_00 + 1);
  }
  QWidgetLineControl::updateCursorBlinking(this_01);
  QWidget::keyReleaseEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QLineEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QLineEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();
    d->control->updateCursorBlinking();
    QWidget::keyReleaseEvent(e);
}